

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void error(QPDF *qpdf,QPDFObjectHandle *node,string *msg)

{
  QPDFExc *this;
  string local_70;
  string local_40;
  string *local_20;
  string *msg_local;
  QPDFObjectHandle *node_local;
  QPDF *qpdf_local;
  
  local_20 = msg;
  msg_local = (string *)node;
  node_local = (QPDFObjectHandle *)qpdf;
  this = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDF::getFilename_abi_cxx11_(&local_40,(QPDF *)node_local);
  get_description_abi_cxx11_(&local_70,(QPDFObjectHandle *)msg_local);
  QPDFExc::QPDFExc(this,qpdf_e_damaged_pdf,&local_40,&local_70,0,local_20);
  __cxa_throw(this,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

static void
error(QPDF& qpdf, QPDFObjectHandle& node, std::string const& msg)
{
    throw QPDFExc(qpdf_e_damaged_pdf, qpdf.getFilename(), get_description(node), 0, msg);
}